

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O2

void __thiscall musicBlock::OPLplayMusic(musicBlock *this,int vol)

{
  uchar *puVar1;
  long lVar2;
  
  for (lVar2 = -0x10; lVar2 != 0; lVar2 = lVar2 + 1) {
    (this->driverdata).channelLastVolume[lVar2] = (uchar)vol;
    *(undefined1 *)((long)this->channels + lVar2 + -0x1c) = 0x7f;
    (this->driverdata).channelModulation[lVar2] = '\0';
    (this->driverdata).channelPan[lVar2] = '@';
    (this->driverdata).channelSustain[lVar2] = '@';
    puVar1 = (this->driverdata).channelExpression + lVar2 * 2;
    puVar1[0] = 0xff;
    puVar1[1] = '?';
    (this->driverdata).channelRPN[lVar2] = 200;
  }
  return;
}

Assistant:

void musicBlock::OPLplayMusic(int vol)
{
	uint i;

	for (i = 0; i < CHANNELS; i++)
	{
		OPLresetControllers(i, vol);
	}
}